

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O0

void cfd::js::api::AddPsbtOutput(Psbt *psbt,PsbtAddOutputRequestStruct *request)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_> *this;
  ByteData local_2c8;
  ByteData local_2b0;
  reference local_298;
  PsbtMapDataStruct *data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  *__range2;
  Script local_268;
  Amount local_230 [16];
  undefined1 local_220 [8];
  Address addr;
  undefined1 local_a8 [8];
  AddressFactory_conflict factory;
  undefined1 local_70 [8];
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  uint32_t index;
  PsbtAddOutputRequestStruct *request_local;
  Psbt *psbt_local;
  
  uVar2 = cfd::core::Psbt::GetTxOutCount();
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30);
  cfd::core::Script::Script((Script *)local_70);
  ParsePsbtOutputRequest
            (&request->output,
             (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30,(Script *)local_70);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cfd::AddressFactory::AddressFactory((AddressFactory *)local_a8);
    cfd::AddressFactory::GetAddress((string *)local_220);
    cfd::core::Amount::Amount(local_230,(request->txout).amount);
    cfd::Psbt::AddTxOutData
              ((Amount *)psbt,(Address *)local_230,(Script *)local_220,(vector *)local_70);
    core::Address::~Address((Address *)local_220);
    AddressFactory::~AddressFactory((AddressFactory *)local_a8);
  }
  else {
    cfd::core::Script::Script(&local_268,(string *)&(request->txout).direct_locking_script);
    cfd::core::Amount::Amount((Amount *)&__range2,(request->txout).amount);
    cfd::core::Psbt::AddTxOut((Script *)psbt,(Amount *)&local_268);
    core::Script::~Script(&local_268);
    cfd::core::Psbt::SetTxOutData((uint)psbt,(Script *)(ulong)uVar2,(vector *)local_70);
  }
  this = &(request->output).unknown;
  __end2 = std::
           vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           ::begin(this);
  data = (PsbtMapDataStruct *)
         std::
         vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
         end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
                                *)&data);
    if (!bVar1) break;
    local_298 = __gnu_cxx::
                __normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
                ::operator*(&__end2);
    cfd::core::ByteData::ByteData(&local_2b0,(string *)local_298);
    cfd::core::ByteData::ByteData(&local_2c8,(string *)&local_298->value);
    cfd::core::Psbt::SetTxOutRecord((uint)psbt,(ByteData *)(ulong)uVar2,&local_2b0);
    core::ByteData::~ByteData(&local_2c8);
    core::ByteData::~ByteData(&local_2b0);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
    ::operator++(&__end2);
  }
  core::Script::~Script((Script *)local_70);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30);
  return;
}

Assistant:

void AddPsbtOutput(Psbt* psbt, const PsbtAddOutputRequestStruct& request) {
  uint32_t index = psbt->GetTxOutCount();

  std::vector<KeyData> key_list;
  Script redeem_script;
  ParsePsbtOutputRequest(request.output, &key_list, &redeem_script);

  if (!request.txout.address.empty()) {
    AddressFactory factory;
    auto addr = factory.GetAddress(request.txout.address);
    psbt->AddTxOutData(
        Amount(request.txout.amount), addr, redeem_script, key_list);
  } else {
    psbt->AddTxOut(
        Script(request.txout.direct_locking_script),
        Amount(request.txout.amount));
    psbt->SetTxOutData(index, redeem_script, key_list);
  }

  for (const auto& data : request.output.unknown) {
    psbt->SetTxOutRecord(index, ByteData(data.key), ByteData(data.value));
  }
}